

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall
tinyusdz::Attribute::get_value<std::array<double,4ul>>(Attribute *this,array<double,_4UL> *v)

{
  value_type *pvVar1;
  optional<std::array<double,_4UL>_> local_70;
  undefined1 local_48 [8];
  optional<std::array<double,_4UL>_> ret;
  array<double,_4UL> *v_local;
  Attribute *this_local;
  
  if (v == (array<double,_4UL> *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    ret.contained._24_8_ = v;
    primvar::PrimVar::get_value<std::array<double,4ul>>(&local_70,&this->_var);
    nonstd::optional_lite::optional<std::array<double,_4UL>_>::optional<std::array<double,_4UL>,_0>
              ((optional<std::array<double,_4UL>_> *)local_48,&local_70);
    nonstd::optional_lite::optional<std::array<double,_4UL>_>::~optional(&local_70);
    this_local._7_1_ = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_48);
    if (this_local._7_1_) {
      pvVar1 = nonstd::optional_lite::optional<std::array<double,_4UL>_>::value
                         ((optional<std::array<double,_4UL>_> *)local_48);
      *(double *)ret.contained._24_8_ = pvVar1->_M_elems[0];
      *(double *)(ret.contained._24_8_ + 8) = pvVar1->_M_elems[1];
      *(double *)(ret.contained._24_8_ + 0x10) = pvVar1->_M_elems[2];
      *(double *)(ret.contained._24_8_ + 0x18) = pvVar1->_M_elems[3];
    }
    nonstd::optional_lite::optional<std::array<double,_4UL>_>::~optional
              ((optional<std::array<double,_4UL>_> *)local_48);
  }
  return this_local._7_1_;
}

Assistant:

bool get_value(T *v) const {
    if (!v) {
      return false;
    }

    nonstd::optional<T> ret = _var.get_value<T>();
    if (ret) {
      (*v) = std::move(ret.value());
      return true;
    }

    return false;
  }